

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2min_distance_targets.cc
# Opt level: O3

S2Cap * __thiscall
S2MinDistanceShapeIndexTarget::GetCapBound
          (S2Cap *__return_storage_ptr__,S2MinDistanceShapeIndexTarget *this)

{
  Iterator *pIVar1;
  S2ShapeIndexRegion<S2ShapeIndex> local_38;
  
  local_38.contains_query_.index_ = this->index_;
  pIVar1 = &local_38.contains_query_.it_;
  local_38.super_S2Region._vptr_S2Region = (_func_int **)&PTR__S2ShapeIndexRegion_002bc838;
  local_38.contains_query_.options_.vertex_model_ = SEMI_OPEN;
  (*(local_38.contains_query_.index_)->_vptr_S2ShapeIndex[6])
            (pIVar1,local_38.contains_query_.index_,2);
  local_38.iter_ = pIVar1;
  S2ShapeIndexRegion<S2ShapeIndex>::GetCapBound(__return_storage_ptr__,&local_38);
  if (local_38.contains_query_.it_.iter_._M_t.
      super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
      ._M_t.
      super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
      .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl !=
      (__uniq_ptr_data<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_38.contains_query_.it_.iter_._M_t.
                          super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                          .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl +
                8))();
  }
  return __return_storage_ptr__;
}

Assistant:

S2Cap S2MinDistanceShapeIndexTarget::GetCapBound() {
  return MakeS2ShapeIndexRegion(index_).GetCapBound();
}